

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

string * __thiscall
wabt::cat<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
          (string *__return_storage_ptr__,wabt *this,char (*args) [6],
          basic_string_view<char,_std::char_traits<char>_> *args_1,char (*args_2) [3])

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cat_compute_size<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
            ((char (*) [6])this,(basic_string_view<char,_std::char_traits<char>_> *)args,
             (char (*) [3])args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
            (__return_storage_ptr__,(char (*) [6])this,
             (basic_string_view<char,_std::char_traits<char>_> *)args,(char (*) [3])args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}